

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::HasInternalHasMethod(FieldDescriptor *field)

{
  uint uVar1;
  CppType CVar2;
  undefined1 local_11;
  FieldDescriptor *field_local;
  
  uVar1 = google::protobuf::internal::cpp::HasHasbit(field);
  local_11 = false;
  if ((uVar1 & 1) == 0) {
    CVar2 = FieldDescriptor::cpp_type(field);
    local_11 = CVar2 == CPPTYPE_MESSAGE;
  }
  return local_11;
}

Assistant:

bool HasInternalHasMethod(const FieldDescriptor* field) {
  return !HasHasbit(field) &&
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE;
}